

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_DamageMaster
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  int flags;
  int iVar2;
  int selector;
  AActor *origin;
  PClassActor *filter;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  VMValue *pVVar6;
  VMValue *pVVar7;
  AActor *source;
  AActor *inflictor;
  char *pcVar8;
  AActor *pAVar9;
  bool bVar10;
  FName local_38;
  FName local_34;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      origin = (AActor *)(param->field_0).field_1.a;
      if (origin != (AActor *)0x0) {
        if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
          (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (origin->super_DThinker).super_DObject.Class;
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003dde17;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          iVar4 = param[1].field_0.i;
          if (numparam < 3) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[2].field_0.field_3.Type != '\0') {
              pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003dde36;
            }
          }
          else {
            pVVar7 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003dde36:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x170f,
                            "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar1 = pVVar7[2].field_0.i;
          if (numparam < 4) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[3].field_0.field_3.Type != '\0') {
              pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003dde55;
            }
          }
          else {
            pVVar7 = param;
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003dde55:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1710,
                            "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          flags = pVVar7[3].field_0.i;
          if (numparam < 5) {
            pVVar7 = defaultparam->Array;
            if ((pVVar7[4].field_0.field_3.Type != '\x03') ||
               ((pVVar6 = pVVar7 + 4, pVVar7[4].field_0.field_1.atag != 1 &&
                ((pVVar6->field_0).field_1.a != (void *)0x0)))) {
              pcVar8 = 
              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
              ;
              goto LAB_003dddf8;
            }
          }
          else if ((param[4].field_0.field_3.Type != '\x03') ||
                  ((pVVar6 = param + 4, param[4].field_0.field_1.atag != 1 &&
                   ((pVVar6->field_0).field_1.a != (void *)0x0)))) {
            pcVar8 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
LAB_003dddf8:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1711,
                          "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          filter = (PClassActor *)(pVVar6->field_0).field_1.a;
          if (numparam < 6) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[5].field_0.field_3.Type != '\0') {
              pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003dde74;
            }
          }
          else {
            pVVar7 = param;
            if (param[5].field_0.field_3.Type != '\0') {
              pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003dde74:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1712,
                            "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar2 = pVVar7[5].field_0.i;
          if (numparam < 7) {
            pVVar7 = defaultparam->Array;
            if (pVVar7[6].field_0.field_3.Type != '\0') {
              pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003dde93;
            }
          }
          else {
            pVVar7 = param;
            if (param[6].field_0.field_3.Type != '\0') {
              pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003dde93:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1713,
                            "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 8) {
            param = defaultparam->Array;
            if (param[7].field_0.field_3.Type == '\0') goto LAB_003ddd10;
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[7].field_0.field_3.Type == '\0') {
LAB_003ddd10:
              selector = param[7].field_0.i;
              source = COPY_AAPTR(origin,pVVar7[6].field_0.i);
              inflictor = COPY_AAPTR(origin,selector);
              pAVar9 = (origin->master).field_0.p;
              if (pAVar9 != (AActor *)0x0) {
                if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
                  pAVar9 = (origin->master).field_0.p;
                  if ((pAVar9 != (AActor *)0x0) &&
                     (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (origin->master).field_0.p = (AActor *)0x0;
                    pAVar9 = (AActor *)0x0;
                  }
                  local_38.Index = iVar2;
                  local_34.Index = iVar1;
                  DoDamage(pAVar9,inflictor,source,iVar4,&local_34,flags,filter,&local_38);
                }
                else {
                  (origin->master).field_0.p = (AActor *)0x0;
                }
              }
              return 0;
            }
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1714,
                        "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar8 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x170e,
                    "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003dde17:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x170d,
                "int AF_AActor_A_DamageMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageMaster)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->master != NULL)
		DoDamage(self->master, inflictor, source, amount, damagetype, flags, filter, species);
	return 0;
}